

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<127UL> * __thiscall GF2::WW<127UL>::ShLo(WW<127UL> *this,size_t shift)

{
  ulong uVar1;
  sbyte sVar2;
  ulong in_RSI;
  WW<127UL> *in_RDI;
  size_t pos;
  size_t wshift;
  ulong local_20;
  
  if (in_RSI < 0x7f) {
    uVar1 = in_RSI >> 6;
    if ((in_RSI & 0x3f) == 0) {
      for (local_20 = 0; local_20 + uVar1 < 2; local_20 = local_20 + 1) {
        in_RDI->_words[local_20] = in_RDI->_words[local_20 + uVar1];
      }
    }
    else {
      for (local_20 = 0; sVar2 = (sbyte)(in_RSI & 0x3f), local_20 + uVar1 + 1 < 2;
          local_20 = local_20 + 1) {
        in_RDI->_words[local_20] =
             in_RDI->_words[local_20 + uVar1] >> sVar2 |
             in_RDI->_words[local_20 + uVar1 + 1] << (0x40U - sVar2 & 0x3f);
      }
      in_RDI->_words[local_20] = in_RDI->_words[local_20 + uVar1] >> sVar2;
      local_20 = local_20 + 1;
    }
    while (local_20 < 2) {
      in_RDI->_words[local_20] = 0;
      local_20 = local_20 + 1;
    }
  }
  else {
    SetAllZero(in_RDI);
  }
  return in_RDI;
}

Assistant:

WW& ShLo(size_t shift)
	{	
		if (shift < _n)
		{
			size_t wshift = shift / B_PER_W, pos;
			// величина сдвига не кратна длине слова?
			if (shift %= B_PER_W)
			{
				// сдвиг всех слов, кроме последнего
				for (pos = 0; pos + wshift + 1 < _wcount; pos++)
					_words[pos] = (_words[pos + wshift] >> shift) |
						(_words[pos + wshift + 1] << (B_PER_W - shift));
				// последнее слово
				_words[pos] = _words[pos + wshift] >> shift, ++pos;
			}
			// величина сдвига кратна длине слова
			else for (pos = 0; pos + wshift < _wcount; ++pos)
				_words[pos] = _words[pos + wshift];
			// обнуление правых слов
			for (; pos < _wcount; _words[pos++] = 0);
		}
		else 
			SetAllZero();
		return *this;
	}